

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O3

int __thiscall kj::_::Debug::Fault::init(Fault *this,EVP_PKEY_CTX *ctx)

{
  ArrayPtr<kj::String> argValues;
  char *pcVar1;
  size_t sVar2;
  Exception *this_00;
  ulong uVar3;
  int in_ECX;
  int in_EDX;
  Type type;
  char *in_R8;
  char *in_R9;
  char *in_stack_00000008;
  String *in_stack_00000010;
  size_t in_stack_ffffffffffffffa0;
  String local_48;
  
  this_00 = (Exception *)operator_new(0x158);
  type = OVERLOADED;
  uVar3 = (ulong)(in_ECX - 0x57U);
  if (in_ECX - 0x57U < 0x24) {
    if ((0x713e000UL >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0x800840001U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_002a1dd4;
      if ((0x122UL >> (uVar3 & 0x3f) & 1) == 0) goto LAB_002a1d9d;
LAB_002a1dcf:
      type = UNIMPLEMENTED;
      goto LAB_002a1dd4;
    }
LAB_002a1d7b:
    type = DISCONNECTED;
  }
  else {
LAB_002a1d9d:
    uVar3 = (ulong)(in_ECX - 0xcU);
    if (in_ECX - 0xcU < 0x35) {
      if ((0x2011801UL >> (uVar3 & 0x3f) & 1) != 0) goto LAB_002a1dd4;
      if ((0x10000000100000U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_002a1d7b;
      if (uVar3 == 0x1a) goto LAB_002a1dcf;
    }
    type = FAILED;
  }
LAB_002a1dd4:
  argValues.size_ = in_stack_ffffffffffffffa0;
  argValues.ptr = in_stack_00000010;
  anon_unknown_2::makeDescriptionImpl
            (&local_48,SYSCALL,in_R8,in_ECX,in_R9,in_stack_00000008,argValues);
  Exception::Exception(this_00,type,(char *)ctx,in_EDX,&local_48);
  sVar2 = local_48.content.size_;
  pcVar1 = local_48.content.ptr;
  this->exception = this_00;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    this = (Fault *)(*(code *)**(undefined8 **)local_48.content.disposer)
                              (local_48.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return (int)this;
}

Assistant:

void Debug::Fault::init(
    const char* file, int line, int osErrorNumber,
    const char* condition, const char* macroArgs, ArrayPtr<String> argValues) {
  exception = new Exception(typeOfErrno(osErrorNumber), file, line,
      makeDescriptionImpl(SYSCALL, condition, osErrorNumber, nullptr, macroArgs, argValues));
}